

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

int mod2sparse_count_col(mod2sparse *m,int col)

{
  int in_ESI;
  long in_RDI;
  int count;
  mod2entry *e;
  int local_1c;
  int *local_18;
  
  if ((-1 < in_ESI) && (in_ESI < *(int *)(in_RDI + 4))) {
    local_1c = 0;
    for (local_18 = *(int **)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 0x38 + 0x20); -1 < *local_18
        ; local_18 = *(int **)(local_18 + 8)) {
      local_1c = local_1c + 1;
    }
    return local_1c;
  }
  fprintf(_stderr,"mod2sparse_count_col: column index out of bounds\n");
  exit(1);
}

Assistant:

int mod2sparse_count_col
( mod2sparse *m,
  int col
)
{
  mod2entry *e;
  int count;

  if (col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_count_col: column index out of bounds\n");
    exit(1);
  }

  count = 0;

  for (e = mod2sparse_first_in_col(m,col);
       !mod2sparse_at_end(e);
       e = mod2sparse_next_in_col(e))
  { count += 1;
  }

  return count;
}